

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

void satoko_reset(satoko_t *s)

{
  satoko_t *s_local;
  
  vec_uint_clear(s->assumptions);
  vec_uint_clear(s->final_conflict);
  cdb_clear(s->all_clauses);
  vec_uint_clear(s->originals);
  vec_uint_clear(s->learnts);
  vec_wl_clean(s->watches);
  vec_sdbl_clear(s->activity);
  heap_clear(s->var_order);
  vec_uint_clear(s->levels);
  vec_uint_clear(s->reasons);
  vec_char_clear(s->assigns);
  vec_char_clear(s->polarity);
  vec_uint_clear(s->trail);
  vec_uint_clear(s->trail_lim);
  b_queue_clean(s->bq_lbd);
  b_queue_clean(s->bq_trail);
  vec_uint_clear(s->temp_lits);
  vec_char_clear(s->seen);
  vec_uint_clear(s->tagged);
  vec_uint_clear(s->stack);
  vec_uint_clear(s->last_dlevel);
  vec_uint_clear(s->stamps);
  s->status = 1;
  s->var_act_inc = SDBL_CONST1;
  s->clause_act_inc = 0x800;
  s->n_confl_bfr_reduce = (ulong)(s->opts).n_conf_fst_reduce;
  s->RC1 = 1;
  s->RC2 = (ulong)(s->opts).n_conf_fst_reduce;
  s->book_cl_orig = 0;
  s->book_cl_lrnt = 0;
  s->book_cdb = 0;
  s->book_vars = 0;
  s->book_trail = 0;
  s->i_qhead = 0;
  return;
}

Assistant:

void satoko_reset(satoko_t *s)
{
    // printf("[Satoko] Reset.\n");
    vec_uint_clear(s->assumptions);
    vec_uint_clear(s->final_conflict);
    cdb_clear(s->all_clauses);
    vec_uint_clear(s->originals);
    vec_uint_clear(s->learnts);
    vec_wl_clean(s->watches);
    vec_act_clear(s->activity);
    heap_clear(s->var_order);
    vec_uint_clear(s->levels);
    vec_uint_clear(s->reasons);
    vec_char_clear(s->assigns);
    vec_char_clear(s->polarity);
    vec_uint_clear(s->trail);
    vec_uint_clear(s->trail_lim);
    b_queue_clean(s->bq_lbd);
    b_queue_clean(s->bq_trail);
    vec_uint_clear(s->temp_lits);
    vec_char_clear(s->seen);
    vec_uint_clear(s->tagged);
    vec_uint_clear(s->stack);
    vec_uint_clear(s->last_dlevel);
    vec_uint_clear(s->stamps);
    s->status = SATOKO_OK;
    s->var_act_inc = VAR_ACT_INIT_INC;
    s->clause_act_inc = CLAUSE_ACT_INIT_INC;
    s->n_confl_bfr_reduce = s->opts.n_conf_fst_reduce;
    s->RC1 = 1;
    s->RC2 = s->opts.n_conf_fst_reduce;
    s->book_cl_orig = 0;
    s->book_cl_lrnt = 0;
    s->book_cdb = 0;
    s->book_vars = 0;
    s->book_trail = 0;
    s->i_qhead = 0;
}